

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O1

string * __thiscall
duckdb::StarExpression::ToString_abi_cxx11_(string *__return_storage_ptr__,StarExpression *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  bool bVar4;
  pointer pPVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  _Hash_node_base *p_Var9;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    if (this->columns == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    sVar2 = (this->relation_name)._M_string_length;
    if (sVar2 == 0) {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,anon_var_dwarf_643547e + 8,anon_var_dwarf_643547e + 9);
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar3 = (this->relation_name)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_98,pcVar3,pcVar3 + sVar2);
      ::std::__cxx11::string::append((char *)&local_98);
    }
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
    paVar1 = &local_98.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((this->exclude_list)._M_h._M_element_count != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      p_Var9 = (this->exclude_list)._M_h._M_before_begin._M_nxt;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        bVar4 = true;
        do {
          if (!bVar4) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          QualifiedColumnName::ToString_abi_cxx11_(&local_98,(QualifiedColumnName *)(p_Var9 + 1));
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          p_Var9 = p_Var9->_M_nxt;
          bVar4 = false;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((this->replace_list)._M_h._M_element_count != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      p_Var9 = (this->replace_list)._M_h._M_before_begin._M_nxt;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        bVar4 = true;
        do {
          if (!bVar4) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                 *)(p_Var9 + 5));
          (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(&local_98,pPVar5);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          KeywordHelper::WriteOptionallyQuoted(&local_98,(string *)(p_Var9 + 1),'\"',true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          p_Var9 = p_Var9->_M_nxt;
          bVar4 = false;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if ((this->rename_list)._M_h._M_element_count != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      p_Var9 = (this->rename_list)._M_h._M_before_begin._M_nxt;
      if (p_Var9 != (_Hash_node_base *)0x0) {
        bVar4 = true;
        do {
          if (!bVar4) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          QualifiedColumnName::ToString_abi_cxx11_(&local_98,(QualifiedColumnName *)(p_Var9 + 1));
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          KeywordHelper::WriteOptionallyQuoted(&local_98,(string *)(p_Var9 + 0x11),'\"',true);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          p_Var9 = p_Var9->_M_nxt;
          bVar4 = false;
        } while (p_Var9 != (_Hash_node_base *)0x0);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    if (this->columns == true) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&this->expr);
    (*(pPVar5->super_BaseExpression)._vptr_BaseExpression[8])(local_50);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1392188);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar6[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar6;
    }
    local_68 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)::std::__cxx11::string::append((char *)&local_70);
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98.field_2._8_8_ = plVar6[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *psVar8;
      local_98._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_98._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string StarExpression::ToString() const {
	string result;
	if (expr) {
		D_ASSERT(columns);
		result += "COLUMNS(" + expr->ToString() + ")";
		return result;
	}
	if (columns) {
		result += "COLUMNS(";
	}
	result += relation_name.empty() ? "*" : relation_name + ".*";
	if (!exclude_list.empty()) {
		result += " EXCLUDE (";
		bool first_entry = true;
		for (auto &entry : exclude_list) {
			if (!first_entry) {
				result += ", ";
			}
			result += entry.ToString();
			first_entry = false;
		}
		result += ")";
	}
	if (!replace_list.empty()) {
		result += " REPLACE (";
		bool first_entry = true;
		for (auto &entry : replace_list) {
			if (!first_entry) {
				result += ", ";
			}
			result += entry.second->ToString();
			result += " AS ";
			result += KeywordHelper::WriteOptionallyQuoted(entry.first);
			first_entry = false;
		}
		result += ")";
	}
	if (!rename_list.empty()) {
		result += " RENAME (";
		bool first_entry = true;
		for (auto &entry : rename_list) {
			if (!first_entry) {
				result += ", ";
			}
			result += entry.first.ToString();
			result += " AS ";
			result += KeywordHelper::WriteOptionallyQuoted(entry.second);
			first_entry = false;
		}
		result += ")";
	}
	if (columns) {
		result += ")";
	}
	return result;
}